

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O2

string * __thiscall SInputFile::InitStr_abi_cxx11_(string *__return_storage_ptr__,SInputFile *this)

{
  bool bVar1;
  int iVar2;
  path relative;
  path canonical;
  path pStack_78;
  path local_50;
  iterator local_28;
  
  bVar1 = std::filesystem::exists(&this->full);
  if (bVar1) {
    std::filesystem::canonical(&local_50);
  }
  else {
    std::filesystem::__cxx11::path::lexically_normal();
  }
  if (Options::FileVerbosity != 2) {
    if (Options::FileVerbosity != 1) {
      std::filesystem::__cxx11::path::filename(&pStack_78,&local_50);
      std::filesystem::__cxx11::path::string(__return_storage_ptr__,&pStack_78);
      std::filesystem::__cxx11::path::~path(&pStack_78);
      goto LAB_00125d1c;
    }
    std::filesystem::__cxx11::path::lexically_proximate(&pStack_78);
    std::filesystem::__cxx11::path::begin(&local_28,&pStack_78);
    iVar2 = std::filesystem::__cxx11::path::compare
                      ((&local_28._M_path)
                       [(*(byte *)&((local_28._M_path)->_M_cmpts)._M_impl._M_t.
                                   super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                   .
                                   super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                                   ._M_head_impl & 3) == 0]);
    if (iVar2 != 0) {
      std::filesystem::__cxx11::path::operator=(&local_50,&pStack_78);
    }
    std::filesystem::__cxx11::path::~path(&pStack_78);
  }
  std::filesystem::__cxx11::path::string(__return_storage_ptr__,&local_50);
LAB_00125d1c:
  std::filesystem::__cxx11::path::~path(&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string SInputFile::InitStr() {
	auto canonical = std::filesystem::exists(full) ? std::filesystem::canonical(full) : full.lexically_normal();
	switch(Options::FileVerbosity) {
		case Options::FNAME_LAUNCH_REL:
			{	// try relative to LaunchDirectory, if outside (starts with "../") then keep absolute
				auto relative = canonical.lexically_proximate(LaunchDirectory);
				if (relative.begin()->compare(DOUBLE_DOT_PARENT)) canonical = std::move(relative);
			}
			[[fallthrough]];
		case Options::FNAME_ABSOLUTE:
			return SJ_force_slash(canonical).string();
		case Options::FNAME_BASE:
		default:
			return canonical.filename().string();
	}
}